

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_activation(NetOptimize *this)

{
  string *psVar1;
  string *psVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  pointer pcVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  Mat local_88;
  long local_38;
  
  pvVar3 = (this->super_ModelWriter).layers;
  lVar15 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar15 != 0) {
    uVar16 = lVar15 >> 3;
    lVar15 = uVar16 + (uVar16 == 0);
    lVar14 = 0;
    local_38 = lVar15;
    do {
      iVar10 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar14]->type);
      if (iVar10 == 0) {
        uVar12 = lVar14 + 1;
        uVar13 = uVar12;
        if (uVar12 < uVar16) {
          iVar10 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar14]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar11 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar12]->type);
            if ((((iVar11 == 0) ||
                 (iVar11 = std::__cxx11::string::compare
                                     ((char *)&(((this->super_ModelWriter).layers)->
                                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                               type), iVar11 == 0)) ||
                (iVar11 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                              type), iVar11 == 0)) &&
               ((pLVar4 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar12],
                piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 == 4 &&
                (uVar13 = uVar12, lVar15 = local_38, *piVar5 == iVar10)))) break;
            uVar12 = uVar12 + 1;
            uVar13 = uVar16;
            lVar15 = local_38;
          } while (uVar12 < uVar16);
        }
        if (uVar13 != uVar16) {
          ppLVar6 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar4 = ppLVar6[lVar14];
          pLVar7 = ppLVar6[uVar13];
          fprintf(_stderr,"fuse_deconvolutiondepthwise_activation %s %s\n",
                  (pLVar4->name)._M_dataplus._M_p);
          psVar1 = &pLVar7->type;
          iVar10 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar10 == 0) {
            if ((*(float *)&pLVar7[1]._vptr_Layer != 0.0) || (NAN(*(float *)&pLVar7[1]._vptr_Layer))
               ) {
              *(undefined4 *)((long)&pLVar4[1].type.field_2 + 8) = 2;
              local_88.cstep = 0;
              local_88.data = (pointer)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              ncnn::Mat::create(&local_88,1,4,(Allocator *)0x0);
              psVar2 = &pLVar4[1].name;
              if ((Mat *)psVar2 != &local_88) {
                piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                piVar5 = (int *)pLVar4[1].name._M_string_length;
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    pcVar8 = pLVar4[1].name._M_dataplus._M_p;
                    plVar9 = *(long **)&pLVar4[1].bottoms.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data;
                    if (plVar9 == (long *)0x0) {
                      if (pcVar8 != (pointer)0x0) {
                        free(pcVar8);
                      }
                    }
                    else {
                      (**(code **)(*plVar9 + 0x18))();
                    }
                  }
                }
                pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined8 *)((long)&pLVar4[1].name._M_string_length + 4) = 0;
                *(undefined8 *)((long)&pLVar4[1].name.field_2 + 4) = 0;
                (psVar2->_M_dataplus)._M_p = (pointer)0x0;
                pLVar4[1].name._M_string_length = 0;
                pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(undefined4 *)
                 &pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = 0;
                pLVar4[1].name._M_dataplus._M_p = (pointer)local_88.data;
                pLVar4[1].name._M_string_length =
                     CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                pLVar4[1].name.field_2._M_allocated_capacity =
                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                *(int *)((long)&pLVar4[1].name.field_2 + 8) = local_88.elempack;
                *(Allocator **)
                 &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_88.allocator;
                *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_88.dims;
                *(int *)((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.w;
                *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_88.h;
                *(int *)((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = local_88.d;
                *(int *)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_88.c;
                pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_88.cstep;
              }
              piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_88.allocator == (Allocator *)0x0) {
                    if ((pointer)local_88.data != (pointer)0x0) {
                      free(local_88.data);
                    }
                  }
                  else {
                    (*(local_88.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              *(undefined4 *)(psVar2->_M_dataplus)._M_p = *(undefined4 *)&pLVar7[1]._vptr_Layer;
              goto LAB_0014a5bb;
            }
            *(undefined4 *)((long)&pLVar4[1].type.field_2 + 8) = 1;
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar10 == 0) {
              *(undefined4 *)((long)&pLVar4[1].type.field_2 + 8) = 3;
              local_88.cstep = 0;
              local_88.data = (pointer)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elempack = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              ncnn::Mat::create(&local_88,2,4,(Allocator *)0x0);
              psVar2 = &pLVar4[1].name;
              if ((Mat *)psVar2 != &local_88) {
                piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                piVar5 = (int *)pLVar4[1].name._M_string_length;
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    pcVar8 = pLVar4[1].name._M_dataplus._M_p;
                    plVar9 = *(long **)&pLVar4[1].bottoms.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data;
                    if (plVar9 == (long *)0x0) {
                      if (pcVar8 != (pointer)0x0) {
                        free(pcVar8);
                      }
                    }
                    else {
                      (**(code **)(*plVar9 + 0x18))();
                    }
                  }
                }
                pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined8 *)((long)&pLVar4[1].name._M_string_length + 4) = 0;
                *(undefined8 *)((long)&pLVar4[1].name.field_2 + 4) = 0;
                (psVar2->_M_dataplus)._M_p = (pointer)0x0;
                pLVar4[1].name._M_string_length = 0;
                pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(undefined4 *)
                 &pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = 0;
                pLVar4[1].name._M_dataplus._M_p = (pointer)local_88.data;
                pLVar4[1].name._M_string_length =
                     CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
                pLVar4[1].name.field_2._M_allocated_capacity =
                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                *(int *)((long)&pLVar4[1].name.field_2 + 8) = local_88.elempack;
                *(Allocator **)
                 &pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_88.allocator;
                *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_88.dims;
                *(int *)((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_88.w;
                *(int *)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_88.h;
                *(int *)((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = local_88.d;
                *(int *)&pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_88.c;
                pLVar4[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_88.cstep;
              }
              piVar5 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_88.allocator == (Allocator *)0x0) {
                    if ((pointer)local_88.data != (pointer)0x0) {
                      free(local_88.data);
                    }
                  }
                  else {
                    (*(local_88.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              pcVar8 = (psVar2->_M_dataplus)._M_p;
              *(undefined4 *)pcVar8 = *(undefined4 *)&pLVar7[1]._vptr_Layer;
              *(undefined4 *)(pcVar8 + 4) = *(undefined4 *)((long)&pLVar7[1]._vptr_Layer + 4);
LAB_0014a5bb:
              local_88.cstep = 0;
              local_88.c = 0;
              local_88.d = 0;
              local_88.h = 0;
              local_88.w = 0;
              local_88.dims = 0;
              local_88.elempack = 0;
              local_88.elemsize._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.refcount._0_4_ = 0;
              local_88.data = (void *)0x0;
            }
            else {
              iVar10 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar10 == 0) {
                *(undefined4 *)((long)&pLVar4[1].type.field_2 + 8) = 4;
              }
            }
          }
          iVar10 = *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar10;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar10].producer = (int)lVar14;
          std::__cxx11::string::_M_replace
                    ((ulong)psVar1,0,(char *)(pLVar7->type)._M_string_length,0x32319a);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar15);
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - Activation to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_activation %s %s\n", deconvolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                deconvolutiondepthwise->activation_type = 1;
            }
            else
            {
                deconvolutiondepthwise->activation_type = 2;
                deconvolutiondepthwise->activation_params = ncnn::Mat(1);
                deconvolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            deconvolutiondepthwise->activation_type = 3;
            deconvolutiondepthwise->activation_params = ncnn::Mat(2);
            deconvolutiondepthwise->activation_params[0] = clip->min;
            deconvolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            deconvolutiondepthwise->activation_type = 4;
        }

        int top_blob_index_final = activation->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}